

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

Status __thiscall
google::protobuf::(anonymous_namespace)::Error<char_const*>(_anonymous_namespace_ *this,char *args)

{
  string_view message;
  string local_60;
  string_view local_40 [3];
  
  local_40[0] = absl::lts_20250127::NullSafeStringView(args);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_60,(lts_20250127 *)local_40,(AlphaNum *)local_40[0]._M_str);
  message._M_str = (char *)local_60._M_string_length;
  message._M_len = (size_t)this;
  absl::lts_20250127::FailedPreconditionError(message);
  std::__cxx11::string::~string((string *)&local_60);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}